

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# solver-opt.h
# Opt level: O0

void __thiscall
mp::SolverOptionManager::AddStoredOption<int>
          (SolverOptionManager *this,char *name,char *description,int *value,ValueArrayRef values)

{
  ValueArrayRef values_00;
  char *description_00;
  int *in_RDI;
  OptionValueInfo *in_R8;
  undefined4 in_R9D;
  OptionPtr *in_stack_00000018;
  SolverOptionManager *in_stack_00000020;
  pointer in_stack_ffffffffffffff88;
  unique_ptr<mp::SolverOption,_std::default_delete<mp::SolverOption>_> *this_00;
  char *in_stack_ffffffffffffffa8;
  StoredOption<int> *in_stack_ffffffffffffffb0;
  unique_ptr<mp::SolverOption,_std::default_delete<mp::SolverOption>_> local_38 [5];
  OptionValueInfo *local_10;
  undefined4 uStack_8;
  undefined4 uStack_4;
  
  local_10 = in_R8;
  uStack_8 = in_R9D;
  description_00 = (char *)operator_new(0xd8);
  values_00._12_4_ = uStack_4;
  values_00.size_ = uStack_8;
  values_00.values_ = local_10;
  StoredOption<int>::StoredOption
            (in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8,description_00,in_RDI,values_00);
  this_00 = local_38;
  std::unique_ptr<mp::SolverOption,std::default_delete<mp::SolverOption>>::
  unique_ptr<std::default_delete<mp::SolverOption>,void>(this_00,in_stack_ffffffffffffff88);
  AddOption(in_stack_00000020,in_stack_00000018);
  std::unique_ptr<mp::SolverOption,_std::default_delete<mp::SolverOption>_>::~unique_ptr(this_00);
  return;
}

Assistant:

void AddStoredOption(const char *name, const char *description,
                       Value& value, ValueArrayRef values = ValueArrayRef()) {
    AddOption(OptionPtr(
                new StoredOption<Value>(
                  name, description, value, values)));
  }